

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::renameRedefinedComponents
          (TraverseSchema *this,DOMElement *redefineElem,SchemaInfo *redefiningSchemaInfo,
          SchemaInfo *redefinedSchemaInfo)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  XMLCh *chars;
  XMLSize_t XVar3;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  XMLStringPool *pXVar4;
  MemoryManager *pMVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  DOMNode *node;
  undefined4 extraout_var;
  short *psVar9;
  XMLCh *chars_00;
  undefined4 extraout_var_00;
  ValueVectorOf<const_xercesc_4_0::DOMElement_*> *pVVar10;
  undefined4 extraout_var_01;
  short *psVar11;
  short *key1;
  
  node = &XUtil::getFirstChildElement(&redefineElem->super_DOMNode)->super_DOMNode;
  if (node != (DOMNode *)0x0) {
    this_00 = &this->fBuffer;
    do {
      iVar7 = (*node->_vptr_DOMNode[0x18])(node);
      key1 = (short *)CONCAT44(extraout_var,iVar7);
      if (key1 != &SchemaSymbols::fgELT_ANNOTATION) {
        psVar9 = &SchemaSymbols::fgELT_ANNOTATION;
        if (key1 == (short *)0x0) {
LAB_0032b581:
          if (*psVar9 == 0) goto LAB_0032b723;
        }
        else {
          psVar9 = &SchemaSymbols::fgELT_ANNOTATION;
          psVar11 = key1;
          do {
            sVar1 = *psVar11;
            if (sVar1 == 0) goto LAB_0032b581;
            psVar11 = psVar11 + 1;
            sVar2 = *psVar9;
            psVar9 = psVar9 + 1;
          } while (sVar1 == sVar2);
        }
        chars_00 = getElementAttValue(this,(DOMElement *)node,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                      NCName);
        chars = this->fTargetNSURIString;
        (this->fBuffer).fIndex = 0;
        if ((chars != (XMLCh *)0x0) && (*chars != L'\0')) {
          XMLBuffer::append(this_00,chars);
        }
        if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
        }
        XVar3 = (this->fBuffer).fIndex;
        (this->fBuffer).fIndex = XVar3 + 1;
        (this->fBuffer).fBuffer[XVar3] = L',';
        XMLBuffer::append(this_00,chars_00);
        this_01 = this->fRedefineComponents;
        pXVar4 = this->fStringPool;
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        iVar7 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])();
        bVar6 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                          (this_01,key1,iVar7);
        if (!bVar6) {
          pXVar4 = this->fStringPool;
          uVar8 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4,key1);
          iVar7 = (*(pXVar4->super_XSerializable)._vptr_XSerializable[10])(pXVar4,(ulong)uVar8);
          bVar6 = validateRedefineNameChange
                            (this,(DOMElement *)node,(XMLCh *)CONCAT44(extraout_var_00,iVar7),
                             chars_00,1,redefiningSchemaInfo);
          if (bVar6) {
            fixRedefinedSchema(this,(DOMElement *)node,redefinedSchemaInfo,
                               (XMLCh *)CONCAT44(extraout_var_00,iVar7),chars_00,1);
          }
          else {
            if (redefiningSchemaInfo->fFailedRedefineList ==
                (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)0x0) {
              pVVar10 = (ValueVectorOf<const_xercesc_4_0::DOMElement_*> *)
                        XMemory::operator_new(0x28,redefiningSchemaInfo->fMemoryManager);
              pMVar5 = redefiningSchemaInfo->fMemoryManager;
              pVVar10->fCallDestructor = false;
              pVVar10->fCurCount = 0;
              pVVar10->fMaxCount = 4;
              pVVar10->fElemList = (DOMElement **)0x0;
              pVVar10->fMemoryManager = pMVar5;
              iVar7 = (*pMVar5->_vptr_MemoryManager[3])();
              pVVar10->fElemList = (DOMElement **)CONCAT44(extraout_var_01,iVar7);
              memset((DOMElement **)CONCAT44(extraout_var_01,iVar7),0,pVVar10->fMaxCount << 3);
              redefiningSchemaInfo->fFailedRedefineList = pVVar10;
            }
            pVVar10 = redefiningSchemaInfo->fFailedRedefineList;
            ValueVectorOf<const_xercesc_4_0::DOMElement_*>::ensureExtraCapacity(pVVar10,1);
            XVar3 = pVVar10->fCurCount;
            pVVar10->fCurCount = XVar3 + 1;
            pVVar10->fElemList[XVar3] = (DOMElement *)node;
          }
        }
      }
LAB_0032b723:
      node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
    } while (node != (DOMNode *)0x0);
  }
  return;
}

Assistant:

void TraverseSchema::renameRedefinedComponents(const DOMElement* const redefineElem,
                                               SchemaInfo* const redefiningSchemaInfo,
                                               SchemaInfo* const redefinedSchemaInfo) {

    DOMElement* child = XUtil::getFirstChildElement(redefineElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        // if component already redefined skip
        const XMLCh* typeName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(typeName);

        if (fRedefineComponents->containsKey(childName, fStringPool->addOrFind(fBuffer.getRawBuffer()))) {
            continue;
        }

        // Rename
        const XMLCh* tmpChildName = fStringPool->getValueForId(fStringPool->addOrFind(childName));

        if (validateRedefineNameChange(child, tmpChildName, typeName, 1, redefiningSchemaInfo)) {
            fixRedefinedSchema(child, redefinedSchemaInfo, tmpChildName, typeName, 1);
        }
        else {
            redefiningSchemaInfo->addFailedRedefine(child);
        }
    }
}